

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::Function::Function
          (Function *this,LocationRange *lr,Fodder *open_fodder,Fodder *paren_left_fodder,
          ArgParams *params,bool trailing_comma,Fodder *paren_right_fodder,AST *body)

{
  AST *in_RCX;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *in_RDI;
  LocationRange *in_R8;
  undefined1 in_R9B;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *unaff_retaddr;
  pointer in_stack_00000010;
  Fodder *in_stack_ffffffffffffffc8;
  undefined3 in_stack_ffffffffffffffd4;
  ASTType type;
  byte bVar1;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *__x;
  
  type = CONCAT13(in_R9B,in_stack_ffffffffffffffd4) & 0x1ffffff;
  __x = in_RDI;
  AST::AST(in_RCX,in_R8,type,in_stack_ffffffffffffffc8);
  bVar1 = (byte)(type >> 0x18);
  (in_RDI->
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__Function_00471b50;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)unaff_retaddr,
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)__x);
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            (unaff_retaddr,__x);
  *(byte *)&in_RDI[7].
            super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
            ._M_impl.super__Vector_impl_data._M_finish = bVar1 & 1;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)unaff_retaddr,
         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)__x);
  in_RDI[8].
  super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = in_stack_00000010;
  return;
}

Assistant:

Function(const LocationRange &lr, const Fodder &open_fodder, const Fodder &paren_left_fodder,
             const ArgParams &params, bool trailing_comma, const Fodder &paren_right_fodder,
             AST *body)
        : AST(lr, AST_FUNCTION, open_fodder),
          parenLeftFodder(paren_left_fodder),
          params(params),
          trailingComma(trailing_comma),
          parenRightFodder(paren_right_fodder),
          body(body)
    {
    }